

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImpl::processSensorEvents(WindowImpl *this)

{
  bool bVar1;
  SensorManager *pSVar2;
  Vector3f *pVVar3;
  Vector3f VVar4;
  undefined1 local_5c [8];
  Event event;
  float local_40;
  undefined1 local_28 [8];
  Vector3f previousValue;
  float local_14;
  Type sensor;
  uint i;
  WindowImpl *this_local;
  
  pSVar2 = SensorManager::getInstance();
  SensorManager::update(pSVar2);
  for (local_14 = 0.0; (uint)local_14 < 6; local_14 = (float)((int)local_14 + 1)) {
    previousValue.z = local_14;
    pSVar2 = SensorManager::getInstance();
    bVar1 = SensorManager::isEnabled(pSVar2,(Type)previousValue.z);
    if (bVar1) {
      previousValue.x = this->m_sensorValue[(uint)local_14].z;
      local_28._0_4_ = this->m_sensorValue[(uint)local_14].x;
      local_28._4_4_ = this->m_sensorValue[(uint)local_14].y;
      pSVar2 = SensorManager::getInstance();
      VVar4 = SensorManager::getValue(pSVar2,(Type)previousValue.z);
      event.field_1._8_8_ = VVar4._0_8_;
      local_40 = VVar4.z;
      pVVar3 = this->m_sensorValue + (uint)local_14;
      pVVar3->x = (float)event.field_1._8_4_;
      pVVar3->y = (float)event.field_1._12_4_;
      pVVar3->z = local_40;
      unique0x10000229 = VVar4;
      bVar1 = sf::operator!=(this->m_sensorValue + (uint)local_14,(Vector3<float> *)local_28);
      if (bVar1) {
        local_5c._0_4_ = SensorChanged;
        local_5c._4_4_ = previousValue.z;
        event.type = (EventType)this->m_sensorValue[(uint)local_14].x;
        event.field_1.size.width = (uint)this->m_sensorValue[(uint)local_14].y;
        event.field_1.size.height = (uint)this->m_sensorValue[(uint)local_14].z;
        pushEvent(this,(Event *)local_5c);
      }
    }
  }
  return;
}

Assistant:

void WindowImpl::processSensorEvents()
{
    // First update the sensor states
    SensorManager::getInstance().update();

    for (unsigned int i = 0; i < Sensor::Count; ++i)
    {
        Sensor::Type sensor = static_cast<Sensor::Type>(i);

        // Only process enabled sensors
        if (SensorManager::getInstance().isEnabled(sensor))
        {
            // Copy the previous value of the sensor and get the new one
            Vector3f previousValue = m_sensorValue[i];
            m_sensorValue[i] = SensorManager::getInstance().getValue(sensor);

            // If the value has changed, trigger an event
            if (m_sensorValue[i] != previousValue) // @todo use a threshold?
            {
                Event event;
                event.type = Event::SensorChanged;
                event.sensor.type = sensor;
                event.sensor.x = m_sensorValue[i].x;
                event.sensor.y = m_sensorValue[i].y;
                event.sensor.z = m_sensorValue[i].z;
                pushEvent(event);
            }
        }
    }
}